

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_gej_neg(secp256k1_gej *r,secp256k1_gej *a)

{
  undefined1 auVar1 [16];
  bool bVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  int iVar7;
  ulong uVar8;
  secp256k1_modinv64_signed62 *psVar9;
  int64_t iVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  uint extraout_EDX;
  ulong uVar15;
  secp256k1_modinv64_modinfo *psVar16;
  secp256k1_modinv64_signed62 *psVar17;
  long lVar18;
  long lVar19;
  secp256k1_modinv64_modinfo *extraout_RDX;
  secp256k1_modinv64_modinfo *extraout_RDX_00;
  secp256k1_modinv64_modinfo *extraout_RDX_01;
  secp256k1_modinv64_modinfo *extraout_RDX_02;
  ulong *extraout_RDX_03;
  secp256k1_modinv64_signed62 *a_00;
  secp256k1_fe *psVar20;
  uint uVar21;
  secp256k1_modinv64_modinfo *psVar22;
  int iVar23;
  int iVar24;
  ulong uVar25;
  secp256k1_fe *a_01;
  secp256k1_modinv64_signed62 *a_02;
  secp256k1_modinv64_signed62 *psVar26;
  secp256k1_modinv64_signed62 *psVar27;
  secp256k1_modinv64_signed62 *psVar28;
  ulong uVar29;
  secp256k1_fe *a_03;
  secp256k1_modinv64_signed62 *psVar30;
  int64_t *piVar31;
  int64_t *piVar32;
  ulong uVar33;
  long lVar34;
  long lVar35;
  secp256k1_modinv64_modinfo *psVar36;
  ulong uVar37;
  secp256k1_modinv64_signed62 *psVar38;
  ulong uVar39;
  secp256k1_modinv64_signed62 *psVar40;
  bool bVar41;
  secp256k1_modinv64_signed62 sStack_3b0;
  secp256k1_modinv64_signed62 sStack_388;
  secp256k1_modinv64_signed62 *psStack_360;
  secp256k1_modinv64_signed62 *psStack_358;
  secp256k1_modinv64_signed62 *psStack_350;
  ulong uStack_340;
  secp256k1_modinv64_signed62 *psStack_338;
  ulong uStack_330;
  secp256k1_modinv64_signed62 *psStack_328;
  secp256k1_modinv64_signed62 *psStack_320;
  secp256k1_modinv64_signed62 *psStack_318;
  secp256k1_modinv64_signed62 *psStack_310;
  int64_t iStack_308;
  secp256k1_modinv64_signed62 *psStack_300;
  secp256k1_modinv64_signed62 *psStack_2f8;
  secp256k1_modinv64_signed62 *psStack_2f0;
  secp256k1_modinv64_signed62 *psStack_2e8;
  int64_t iStack_2e0;
  secp256k1_modinv64_signed62 *psStack_2d8;
  int64_t iStack_2d0;
  int64_t iStack_2c8;
  secp256k1_fe *psStack_2c0;
  secp256k1_modinv64_modinfo *psStack_2b8;
  secp256k1_modinv64_signed62 *psStack_2b0;
  ulong uStack_2a8;
  secp256k1_modinv64_signed62 *psStack_2a0;
  secp256k1_modinv64_modinfo *psStack_298;
  code *pcStack_290;
  ulong uStack_280;
  secp256k1_modinv64_signed62 *psStack_278;
  secp256k1_modinv64_signed62 *psStack_270;
  secp256k1_modinv64_signed62 *psStack_268;
  secp256k1_modinv64_signed62 *psStack_260;
  secp256k1_modinv64_signed62 *psStack_258;
  secp256k1_modinv64_signed62 *psStack_250;
  secp256k1_modinv64_modinfo *psStack_248;
  secp256k1_modinv64_signed62 *psStack_240;
  secp256k1_modinv64_signed62 sStack_238;
  long lStack_208;
  secp256k1_fe *psStack_200;
  ulong uStack_1f8;
  ulong uStack_1f0;
  secp256k1_fe *psStack_1e8;
  ulong uStack_1e0;
  ulong uStack_1d8;
  secp256k1_modinv64_modinfo *psStack_1d0;
  ulong uStack_1c8;
  secp256k1_modinv64_signed62 *psStack_1c0;
  secp256k1_modinv64_signed62 sStack_1b8;
  secp256k1_modinv64_signed62 sStack_188;
  secp256k1_modinv64_trans2x2 sStack_158;
  secp256k1_modinv64_signed62 sStack_138;
  secp256k1_modinv64_signed62 sStack_108;
  secp256k1_fe sStack_d8;
  secp256k1_gej *psStack_a0;
  
  secp256k1_gej_verify(a);
  r->infinity = a->infinity;
  uVar3 = (a->x).n[0];
  uVar4 = (a->x).n[1];
  uVar5 = (a->x).n[2];
  uVar6 = (a->x).n[3];
  iVar7 = (a->x).magnitude;
  iVar24 = (a->x).normalized;
  (r->x).n[4] = (a->x).n[4];
  (r->x).magnitude = iVar7;
  (r->x).normalized = iVar24;
  (r->x).n[2] = uVar5;
  (r->x).n[3] = uVar6;
  (r->x).n[0] = uVar3;
  (r->x).n[1] = uVar4;
  psVar20 = &r->y;
  uVar3 = (a->y).n[1];
  uVar4 = (a->y).n[2];
  uVar5 = (a->y).n[3];
  uVar6 = (a->y).n[4];
  iVar7 = (a->y).magnitude;
  iVar24 = (a->y).normalized;
  (r->y).n[0] = (a->y).n[0];
  (r->y).n[1] = uVar3;
  (r->y).n[2] = uVar4;
  (r->y).n[3] = uVar5;
  (r->y).n[4] = uVar6;
  (r->y).magnitude = iVar7;
  (r->y).normalized = iVar24;
  uVar3 = (a->z).n[1];
  uVar4 = (a->z).n[2];
  uVar5 = (a->z).n[3];
  uVar6 = (a->z).n[4];
  iVar7 = (a->z).magnitude;
  iVar24 = (a->z).normalized;
  (r->z).n[0] = (a->z).n[0];
  (r->z).n[1] = uVar3;
  (r->z).n[2] = uVar4;
  (r->z).n[3] = uVar5;
  (r->z).n[4] = uVar6;
  (r->z).magnitude = iVar7;
  (r->z).normalized = iVar24;
  secp256k1_fe_verify(psVar20);
  uVar12 = (r->y).n[4];
  uVar15 = (uVar12 >> 0x30) * 0x1000003d1 + (r->y).n[0];
  uVar8 = (uVar15 >> 0x34) + (r->y).n[1];
  uVar25 = (uVar8 >> 0x34) + (r->y).n[2];
  uVar29 = (uVar25 >> 0x34) + (r->y).n[3];
  a_01 = (secp256k1_fe *)(uVar25 & 0xfffffffffffff);
  (r->y).n[0] = uVar15 & 0xfffffffffffff;
  (r->y).n[1] = uVar8 & 0xfffffffffffff;
  (r->y).n[2] = (uint64_t)a_01;
  (r->y).n[3] = uVar29 & 0xfffffffffffff;
  (r->y).n[4] = (uVar29 >> 0x34) + (uVar12 & 0xffffffffffff);
  (r->y).magnitude = 1;
  secp256k1_fe_verify(psVar20);
  a_03 = psVar20;
  secp256k1_fe_verify(psVar20);
  if ((r->y).magnitude < 2) {
    uVar3 = (r->y).n[1];
    uVar4 = (r->y).n[2];
    uVar5 = (r->y).n[3];
    (r->y).n[0] = 0x3ffffbfffff0bc - (r->y).n[0];
    (r->y).n[1] = 0x3ffffffffffffc - uVar3;
    (r->y).n[2] = 0x3ffffffffffffc - uVar4;
    (r->y).n[3] = 0x3ffffffffffffc - uVar5;
    (r->y).n[4] = 0x3fffffffffffc - (r->y).n[4];
    (r->y).magnitude = 2;
    (r->y).normalized = 0;
    secp256k1_fe_verify(psVar20);
    secp256k1_gej_verify(r);
    return;
  }
  secp256k1_gej_neg_cold_1();
  if (extraout_EDX < 2) {
    secp256k1_fe_verify(a_01);
    secp256k1_fe_verify(a_03);
    uVar12 = (long)(int)extraout_EDX - 1;
    uVar8 = -(long)(int)extraout_EDX;
    a_03->n[0] = a_01->n[0] & uVar8 | a_03->n[0] & uVar12;
    a_03->n[1] = a_01->n[1] & uVar8 | a_03->n[1] & uVar12;
    a_03->n[2] = a_01->n[2] & uVar8 | a_03->n[2] & uVar12;
    a_03->n[3] = a_01->n[3] & uVar8 | a_03->n[3] & uVar12;
    a_03->n[4] = uVar8 & a_01->n[4] | uVar12 & a_03->n[4];
    if (a_03->magnitude < a_01->magnitude) {
      a_03->magnitude = a_01->magnitude;
    }
    if (a_01->normalized == 0) {
      a_03->normalized = 0;
    }
    secp256k1_fe_verify(a_03);
    return;
  }
  secp256k1_fe_cmov_cold_1();
  psVar16 = (secp256k1_modinv64_modinfo *)0x0;
  pcStack_290 = (code *)0x11b7a2;
  psStack_1e8 = a_03;
  psStack_a0 = r;
  secp256k1_fe_verify(a_01);
  lStack_208 = 0x1000003d1;
  uVar12 = (a_01->n[4] >> 0x30) * 0x1000003d1 + a_01->n[0];
  uVar29 = (uVar12 >> 0x34) + a_01->n[1];
  uVar8 = (uVar29 >> 0x34) + a_01->n[2];
  uVar15 = (uVar8 >> 0x34) + a_01->n[3];
  uVar25 = (uVar15 >> 0x34) + (a_01->n[4] & 0xffffffffffff);
  uStack_1f0 = (uVar29 | uVar12 | uVar8 | uVar15) & 0xfffffffffffff | uVar25;
  uStack_1f8 = (uVar12 ^ 0x1000003d0) & uVar29 & uVar8 & uVar15 & (uVar25 ^ 0xf000000000000);
  pcStack_290 = (code *)0x11b825;
  secp256k1_fe_verify(a_01);
  sStack_d8.n[0] = a_01->n[0];
  sStack_d8.n[1] = a_01->n[1];
  sStack_d8.n[2] = a_01->n[2];
  sStack_d8.n[3] = a_01->n[3];
  sStack_d8.n[4] = a_01->n[4];
  sStack_d8.magnitude = a_01->magnitude;
  sStack_d8.normalized = a_01->normalized;
  pcStack_290 = (code *)0x11b857;
  psStack_200 = a_01;
  secp256k1_fe_normalize(&sStack_d8);
  sStack_1b8.v[0] = (sStack_d8.n[1] << 0x34 | sStack_d8.n[0]) & 0x3fffffffffffffff;
  a_02 = (secp256k1_modinv64_signed62 *)
         ((ulong)((uint)sStack_d8.n[2] & 0xfffff) << 0x2a | sStack_d8.n[1] >> 10);
  uStack_280 = (ulong)((uint)sStack_d8.n[3] & 0x3fffffff) << 0x20 | sStack_d8.n[2] >> 0x14;
  psStack_240 = (secp256k1_modinv64_signed62 *)
                ((sStack_d8.n[4] & 0xffffffffff) << 0x16 | sStack_d8.n[3] >> 0x1e);
  uVar12 = sStack_d8.n[4] >> 0x28;
  sStack_138.v[4] = 0;
  sStack_138.v[2] = 0;
  sStack_138.v[3] = 0;
  sStack_138.v[0] = 0;
  sStack_138.v[1] = 0;
  sStack_108.v[1] = 0;
  sStack_108.v[4] = 0;
  sStack_108.v[2] = 0;
  sStack_108.v[3] = 0;
  sStack_108.v[0] = 1;
  psVar30 = &sStack_238;
  sStack_238.v[2] = 0;
  sStack_238.v[3] = 0;
  sStack_238.v[0] = -0x1000003d1;
  sStack_238.v[1] = 0;
  sStack_238.v[4] = 0x100;
  psStack_250 = (secp256k1_modinv64_signed62 *)0;
  psStack_260 = (secp256k1_modinv64_signed62 *)0;
  psStack_268 = (secp256k1_modinv64_signed62 *)0;
  psStack_248 = (secp256k1_modinv64_modinfo *)0x100;
  psVar20 = (secp256k1_fe *)0xffffffffffffffff;
  psVar28 = (secp256k1_modinv64_signed62 *)sStack_1b8.v[0];
  psVar17 = (secp256k1_modinv64_signed62 *)-0x1000003d1;
  psStack_278 = a_02;
  sStack_1b8.v[1] = (int64_t)a_02;
  sStack_1b8.v[2] = uStack_280;
  sStack_1b8.v[3] = (int64_t)psStack_240;
  sStack_1b8.v[4] = uVar12;
  sStack_188.v[0] = sStack_1b8.v[0];
  sStack_188.v[1] = (int64_t)a_02;
  sStack_188.v[2] = uStack_280;
  sStack_188.v[3] = (int64_t)psStack_240;
  sStack_188.v[4] = uVar12;
  do {
    psVar22 = (secp256k1_modinv64_modinfo *)0x8;
    lVar13 = 3;
    uVar8 = 0;
    psVar27 = (secp256k1_modinv64_signed62 *)0x0;
    psVar36 = (secp256k1_modinv64_modinfo *)0x8;
    psVar9 = psVar28;
    psVar38 = psVar17;
    do {
      psStack_1d0 = psVar16;
      if (((ulong)psVar38 & 1) == 0) {
        pcStack_290 = (code *)0x11c4ce;
        secp256k1_fe_inv_cold_30();
        psVar26 = a_02;
LAB_0011c4ce:
        pcStack_290 = (code *)0x11c4d3;
        secp256k1_fe_inv_cold_1();
LAB_0011c4d3:
        pcStack_290 = (code *)0x11c4d8;
        secp256k1_fe_inv_cold_2();
LAB_0011c4d8:
        pcStack_290 = (code *)0x11c4dd;
        secp256k1_fe_inv_cold_29();
        psVar9 = psVar30;
        goto LAB_0011c4dd;
      }
      psVar30 = (secp256k1_modinv64_signed62 *)
                (uVar8 * (long)psVar28 + (long)psVar22 * (long)psVar17);
      psVar26 = (secp256k1_modinv64_signed62 *)((long)psVar38 << ((byte)lVar13 & 0x3f));
      if (psVar30 != psVar26) goto LAB_0011c4ce;
      psVar30 = (secp256k1_modinv64_signed62 *)
                ((long)psVar36 * (long)psVar28 + (long)psVar27 * (long)psVar17);
      psVar26 = (secp256k1_modinv64_signed62 *)((long)psVar9 << ((byte)lVar13 & 0x3f));
      if (psVar30 != psVar26) goto LAB_0011c4d3;
      a_02 = (secp256k1_modinv64_signed62 *)((long)psVar20 >> 0x3f);
      uStack_1c8 = (ulong)((uint)psVar9 & 1);
      uVar15 = -uStack_1c8;
      psVar30 = (secp256k1_modinv64_signed62 *)((ulong)a_02 & uVar15);
      psVar20 = (secp256k1_fe *)((ulong)psVar20 ^ (ulong)psVar30);
      psVar26 = a_02;
      psStack_1c0 = a_02;
      if ((undefined1 *)((long)psVar20[-0xd].n + 0x1fU) < (undefined1 *)0xfffffffffffffb61)
      goto LAB_0011c4d8;
      psVar20 = (secp256k1_fe *)((long)&psVar20[-1].normalized + 3);
      psVar36 = (secp256k1_modinv64_modinfo *)
                ((long)(psVar36->modulus).v + (((ulong)a_02 ^ uVar8) - (long)a_02 & uVar15));
      uVar8 = (uVar8 + ((ulong)psVar36 & (ulong)psVar30)) * 2;
      psVar27 = (secp256k1_modinv64_signed62 *)
                ((long)psVar27->v + (((ulong)a_02 ^ (ulong)psVar22) - (long)a_02 & uVar15));
      psVar22 = (secp256k1_modinv64_modinfo *)
                (((long)(psVar22->modulus).v + ((ulong)psVar27 & (ulong)psVar30)) * 2);
      uVar15 = (long)psVar9->v + (((ulong)a_02 ^ (ulong)psVar38) - (long)a_02 & uVar15);
      psVar9 = (secp256k1_modinv64_signed62 *)(uVar15 >> 1);
      psVar38 = (secp256k1_modinv64_signed62 *)((long)psVar38->v + (uVar15 & (ulong)psVar30));
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0x3e);
    psVar26 = (secp256k1_modinv64_signed62 *)(uVar8 * (long)psVar27);
    psVar16 = SUB168(SEXT816((long)uVar8) * SEXT816((long)psVar27),8);
    psVar9 = psVar30;
    sStack_158.u = (int64_t)psVar22;
    sStack_158.v = uVar8;
    sStack_158.q = (int64_t)psVar27;
    sStack_158.r = (int64_t)psVar36;
    if ((SUB168(SEXT816((long)psVar22) * SEXT816((long)psVar36),8) - (long)psVar16) -
        (ulong)((secp256k1_modinv64_signed62 *)((long)psVar22 * (long)psVar36) < psVar26) != 2 ||
        (long)psVar22 * (long)psVar36 - (long)psVar26 != 0) {
LAB_0011c4dd:
      pcStack_290 = (code *)0x11c4e2;
      secp256k1_fe_inv_cold_3();
LAB_0011c4e2:
      pcStack_290 = (code *)0x11c4e7;
      secp256k1_fe_inv_cold_28();
LAB_0011c4e7:
      pcStack_290 = (code *)0x11c4ec;
      secp256k1_fe_inv_cold_27();
LAB_0011c4ec:
      pcStack_290 = (code *)0x11c4f1;
      secp256k1_fe_inv_cold_26();
LAB_0011c4f1:
      pcStack_290 = (code *)0x11c4f6;
      secp256k1_fe_inv_cold_25();
LAB_0011c4f6:
      pcStack_290 = (code *)0x11c4fb;
      secp256k1_fe_inv_cold_4();
LAB_0011c4fb:
      pcStack_290 = (code *)0x11c500;
      secp256k1_fe_inv_cold_5();
LAB_0011c500:
      pcStack_290 = (code *)0x11c505;
      secp256k1_fe_inv_cold_6();
LAB_0011c505:
      pcStack_290 = (code *)0x11c50a;
      secp256k1_fe_inv_cold_7();
LAB_0011c50a:
      pcStack_290 = (code *)0x11c50f;
      secp256k1_fe_inv_cold_8();
LAB_0011c50f:
      pcStack_290 = (code *)0x11c514;
      secp256k1_fe_inv_cold_9();
LAB_0011c514:
      pcStack_290 = (code *)0x11c519;
      secp256k1_fe_inv_cold_10();
      psVar38 = psVar17;
LAB_0011c519:
      pcStack_290 = (code *)0x11c51e;
      secp256k1_fe_inv_cold_11();
      psVar30 = psStack_250;
LAB_0011c51e:
      psStack_250 = psVar30;
      pcStack_290 = (code *)0x11c523;
      secp256k1_fe_inv_cold_12();
      psVar16 = psVar22;
      uVar12 = uVar8;
LAB_0011c523:
      pcStack_290 = (code *)0x11c528;
      secp256k1_fe_inv_cold_13();
      psVar40 = psVar27;
LAB_0011c528:
      pcStack_290 = (code *)0x11c52d;
      secp256k1_fe_inv_cold_14();
LAB_0011c52d:
      pcStack_290 = (code *)0x11c532;
      secp256k1_fe_inv_cold_15();
LAB_0011c532:
      pcStack_290 = (code *)0x11c537;
      secp256k1_fe_inv_cold_24();
      a_02 = psVar26;
      psVar30 = psVar9;
LAB_0011c537:
      pcStack_290 = (code *)0x11c53c;
      secp256k1_fe_inv_cold_23();
LAB_0011c53c:
      pcStack_290 = (code *)0x11c541;
      secp256k1_fe_inv_cold_22();
LAB_0011c541:
      pcStack_290 = (code *)0x11c546;
      secp256k1_fe_inv_cold_21();
LAB_0011c546:
      pcStack_290 = (code *)0x11c54b;
      secp256k1_fe_inv_cold_20();
LAB_0011c54b:
      psVar17 = psVar38;
      pcStack_290 = (code *)0x11c550;
      secp256k1_fe_inv_cold_19();
      goto LAB_0011c550;
    }
    pcStack_290 = (code *)0x11bb3b;
    psStack_270 = psVar28;
    psStack_258 = psVar17;
    uStack_1d8 = uVar12;
    secp256k1_modinv64_update_de_62(&sStack_138,&sStack_108,&sStack_158,psVar16);
    psVar17 = &sStack_238;
    psVar26 = (secp256k1_modinv64_signed62 *)0x5;
    pcStack_290 = (code *)0x11bb5b;
    psVar9 = psVar17;
    iVar7 = secp256k1_modinv64_mul_cmp_62(psVar17,5,&secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar7 < 1) goto LAB_0011c4e2;
    psVar26 = (secp256k1_modinv64_signed62 *)0x5;
    pcStack_290 = (code *)0x11bb7c;
    psVar9 = psVar17;
    iVar7 = secp256k1_modinv64_mul_cmp_62(psVar17,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (0 < iVar7) goto LAB_0011c4e7;
    psVar17 = &sStack_188;
    psVar26 = (secp256k1_modinv64_signed62 *)0x5;
    pcStack_290 = (code *)0x11bba7;
    psVar9 = psVar17;
    iVar7 = secp256k1_modinv64_mul_cmp_62(psVar17,5,&secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar7 < 1) goto LAB_0011c4ec;
    psVar26 = (secp256k1_modinv64_signed62 *)0x5;
    pcStack_290 = (code *)0x11bbc8;
    psVar9 = psVar17;
    iVar7 = secp256k1_modinv64_mul_cmp_62(psVar17,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar7) goto LAB_0011c4f1;
    psVar9 = (secp256k1_modinv64_signed62 *)((long)psVar22 * (long)psStack_258);
    lVar13 = SUB168(SEXT816((long)psVar22) * SEXT816((long)psStack_258),8);
    uVar12 = uVar8 * (long)psStack_270;
    psVar26 = SUB168(SEXT816((long)uVar8) * SEXT816((long)psStack_270),8);
    if ((-1 < (long)psVar26) &&
       (uVar15 = (ulong)((secp256k1_modinv64_signed62 *)(-1 - uVar12) < psVar9),
       lVar14 = (0x7fffffffffffffff - (long)psVar26) - lVar13,
       (SBORROW8(0x7fffffffffffffff - (long)psVar26,lVar13) != SBORROW8(lVar14,uVar15)) !=
       (long)(lVar14 - uVar15) < 0)) goto LAB_0011c4f6;
    piVar31 = (int64_t *)((long)psVar9->v + uVar12);
    psVar26 = (secp256k1_modinv64_signed62 *)
              ((long)psVar26->v + (ulong)CARRY8(uVar12,(ulong)psVar9) + lVar13);
    uVar12 = (long)psVar27 * (long)psStack_258;
    psVar9 = SUB168(SEXT816((long)psVar27) * SEXT816((long)psStack_258),8);
    uVar15 = (long)psVar36 * (long)psStack_270;
    lVar13 = SUB168(SEXT816((long)psVar36) * SEXT816((long)psStack_270),8);
    if ((-1 < lVar13) &&
       (uVar25 = (ulong)(-uVar15 - 1 < uVar12),
       lVar14 = (0x7fffffffffffffff - lVar13) - (long)psVar9,
       (SBORROW8(0x7fffffffffffffff - lVar13,(long)psVar9) != SBORROW8(lVar14,uVar25)) !=
       (long)(lVar14 - uVar25) < 0)) goto LAB_0011c4fb;
    psVar9 = (secp256k1_modinv64_signed62 *)
             ((long)psVar9->v + (ulong)CARRY8(uVar12,uVar15) + lVar13);
    if (((ulong)piVar31 & 0x3ffffffffffffffe) != 0) goto LAB_0011c500;
    if ((uVar12 + uVar15 & 0x3fffffffffffffff) != 0) goto LAB_0011c505;
    uVar25 = (ulong)piVar31 >> 0x3e | (long)psVar26 * 4;
    psStack_258 = (secp256k1_modinv64_signed62 *)((long)psVar22 * (long)psStack_250 + uVar25);
    lVar14 = SUB168(SEXT816((long)psVar22) * SEXT816((long)psStack_250),8) + ((long)psVar26 >> 0x3e)
             + (ulong)CARRY8((long)psVar22 * (long)psStack_250,uVar25);
    psStack_270 = (secp256k1_modinv64_signed62 *)(uVar8 * (long)psStack_278);
    psVar17 = SUB168(SEXT816((long)uVar8) * SEXT816((long)psStack_278),8);
    uVar25 = (ulong)((secp256k1_modinv64_signed62 *)(-1 - (long)psStack_270) < psStack_258);
    lVar13 = (0x7fffffffffffffff - (long)psVar17) - lVar14;
    psVar26 = (secp256k1_modinv64_signed62 *)
              ((-0x8000000000000000 - (long)psVar17) -
              (ulong)(psStack_270 != (secp256k1_modinv64_signed62 *)0x0));
    bVar41 = (SBORROW8(0x7fffffffffffffff - (long)psVar17,lVar14) != SBORROW8(lVar13,uVar25)) ==
             (long)(lVar13 - uVar25) < 0;
    if ((long)psVar17 < 0) {
      bVar41 = (SBORROW8(lVar14,(long)psVar26) !=
               SBORROW8(lVar14 - (long)psVar26,
                        (ulong)(psStack_258 < (secp256k1_modinv64_signed62 *)-(long)psStack_270)))
               == (long)((lVar14 - (long)psVar26) -
                        (ulong)(psStack_258 < (secp256k1_modinv64_signed62 *)-(long)psStack_270)) <
                  0;
    }
    if (!bVar41) goto LAB_0011c50a;
    uVar12 = uVar12 + uVar15 >> 0x3e | (long)psVar9 * 4;
    uVar25 = (long)psVar27 * (long)psStack_250 + uVar12;
    psVar26 = (secp256k1_modinv64_signed62 *)
              (SUB168(SEXT816((long)psVar27) * SEXT816((long)psStack_250),8) +
               ((long)psVar9 >> 0x3e) + (ulong)CARRY8((long)psVar27 * (long)psStack_250,uVar12));
    uVar15 = (long)psVar36 * (long)psStack_278;
    lVar18 = SUB168(SEXT816((long)psVar36) * SEXT816((long)psStack_278),8);
    uVar12 = (ulong)(-uVar15 - 1 < uVar25);
    lVar13 = (0x7fffffffffffffff - lVar18) - (long)psVar26;
    lVar34 = (-0x8000000000000000 - lVar18) - (ulong)(uVar15 != 0);
    lVar19 = (long)psVar26 - lVar34;
    bVar41 = (SBORROW8(0x7fffffffffffffff - lVar18,(long)psVar26) != SBORROW8(lVar13,uVar12)) ==
             (long)(lVar13 - uVar12) < 0;
    if (lVar18 < 0) {
      bVar41 = (SBORROW8((long)psVar26,lVar34) != SBORROW8(lVar19,(ulong)(uVar25 < -uVar15))) ==
               (long)(lVar19 - (ulong)(uVar25 < -uVar15)) < 0;
    }
    psVar9 = (secp256k1_modinv64_signed62 *)(ulong)bVar41;
    if (bVar41 == false) goto LAB_0011c50f;
    uVar29 = (long)psStack_270->v + (long)psStack_258->v;
    lVar13 = (long)psVar17->v + (ulong)CARRY8((ulong)psStack_258,(ulong)psStack_270) + lVar14;
    psVar26 = (secp256k1_modinv64_signed62 *)
              ((long)psVar26->v + (ulong)CARRY8(uVar25,uVar15) + lVar18);
    uVar12 = lVar13 * 4 | uVar29 >> 0x3e;
    psStack_258 = (secp256k1_modinv64_signed62 *)(uVar29 & 0x3fffffffffffffff);
    psVar17 = (secp256k1_modinv64_signed62 *)(uVar25 + uVar15 & 0x3fffffffffffffff);
    psVar30 = (secp256k1_modinv64_signed62 *)((long)psVar22 * (long)psStack_260 + uVar12);
    lVar14 = (lVar13 >> 0x3e) + SUB168(SEXT816((long)psVar22) * SEXT816((long)psStack_260),8) +
             (ulong)CARRY8((long)psVar22 * (long)psStack_260,uVar12);
    uStack_1e0 = uVar8 * uStack_280;
    psStack_278 = SUB168(SEXT816((long)uVar8) * SEXT816((long)uStack_280),8);
    uVar12 = (ulong)((secp256k1_modinv64_signed62 *)(-1 - uStack_1e0) < psVar30);
    lVar13 = (0x7fffffffffffffff - (long)psStack_278) - lVar14;
    psVar9 = (secp256k1_modinv64_signed62 *)
             ((-0x8000000000000000 - (long)psStack_278) - (ulong)(uStack_1e0 != 0));
    bVar41 = (SBORROW8(0x7fffffffffffffff - (long)psStack_278,lVar14) != SBORROW8(lVar13,uVar12)) ==
             (long)(lVar13 - uVar12) < 0;
    if ((long)psStack_278 < 0) {
      bVar41 = (SBORROW8(lVar14,(long)psVar9) !=
               SBORROW8(lVar14 - (long)psVar9,
                        (ulong)(psVar30 < (secp256k1_modinv64_signed62 *)-uStack_1e0))) ==
               (long)((lVar14 - (long)psVar9) -
                     (ulong)(psVar30 < (secp256k1_modinv64_signed62 *)-uStack_1e0)) < 0;
    }
    psStack_270 = psVar17;
    psStack_250 = psVar30;
    sStack_238.v[0] = (int64_t)psStack_258;
    sStack_188.v[0] = (int64_t)psVar17;
    if (!bVar41) goto LAB_0011c514;
    uVar12 = uVar25 + uVar15 >> 0x3e | (long)psVar26 * 4;
    uVar25 = (long)psVar27 * (long)psStack_260 + uVar12;
    psVar9 = (secp256k1_modinv64_signed62 *)
             (SUB168(SEXT816((long)psVar27) * SEXT816((long)psStack_260),8) +
              ((long)psVar26 >> 0x3e) + (ulong)CARRY8((long)psVar27 * (long)psStack_260,uVar12));
    uVar15 = (long)psVar36 * uStack_280;
    lVar18 = SUB168(SEXT816((long)psVar36) * SEXT816((long)uStack_280),8);
    uVar12 = (ulong)(-uVar15 - 1 < uVar25);
    lVar13 = (0x7fffffffffffffff - lVar18) - (long)psVar9;
    lVar34 = (-0x8000000000000000 - lVar18) - (ulong)(uVar15 != 0);
    lVar19 = (long)psVar9 - lVar34;
    bVar41 = (SBORROW8(0x7fffffffffffffff - lVar18,(long)psVar9) != SBORROW8(lVar13,uVar12)) ==
             (long)(lVar13 - uVar12) < 0;
    if (lVar18 < 0) {
      bVar41 = (SBORROW8((long)psVar9,lVar34) != SBORROW8(lVar19,(ulong)(uVar25 < -uVar15))) ==
               (long)(lVar19 - (ulong)(uVar25 < -uVar15)) < 0;
    }
    psVar26 = (secp256k1_modinv64_signed62 *)(ulong)bVar41;
    psVar38 = psVar17;
    if (bVar41 == false) goto LAB_0011c519;
    piVar31 = (int64_t *)((long)psVar30->v + uStack_1e0);
    lVar13 = (long)psStack_278->v + (ulong)CARRY8((ulong)psVar30,uStack_1e0) + lVar14;
    psVar9 = (secp256k1_modinv64_signed62 *)
             ((long)psVar9->v + (ulong)CARRY8(uVar25,uVar15) + lVar18);
    uVar12 = lVar13 * 4 | (ulong)piVar31 >> 0x3e;
    psStack_250 = (secp256k1_modinv64_signed62 *)((ulong)piVar31 & 0x3fffffffffffffff);
    psStack_278 = (secp256k1_modinv64_signed62 *)(uVar25 + uVar15 & 0x3fffffffffffffff);
    psStack_260 = (secp256k1_modinv64_signed62 *)((long)psVar22 * (long)psStack_268 + uVar12);
    lVar14 = (lVar13 >> 0x3e) + SUB168(SEXT816((long)psVar22) * SEXT816((long)psStack_268),8) +
             (ulong)CARRY8((long)psVar22 * (long)psStack_268,uVar12);
    uStack_280 = uVar8 * (long)psStack_240;
    lVar19 = SUB168(SEXT816((long)uVar8) * SEXT816((long)psStack_240),8);
    uVar12 = (ulong)((secp256k1_modinv64_signed62 *)(-1 - uStack_280) < psStack_260);
    lVar13 = (0x7fffffffffffffff - lVar19) - lVar14;
    psVar26 = (secp256k1_modinv64_signed62 *)
              ((-0x8000000000000000 - lVar19) - (ulong)(uStack_280 != 0));
    bVar41 = (SBORROW8(0x7fffffffffffffff - lVar19,lVar14) != SBORROW8(lVar13,uVar12)) ==
             (long)(lVar13 - uVar12) < 0;
    if (lVar19 < 0) {
      bVar41 = (SBORROW8(lVar14,(long)psVar26) !=
               SBORROW8(lVar14 - (long)psVar26,
                        (ulong)(psStack_260 < (secp256k1_modinv64_signed62 *)-uStack_280))) ==
               (long)((lVar14 - (long)psVar26) -
                     (ulong)(psStack_260 < (secp256k1_modinv64_signed62 *)-uStack_280)) < 0;
    }
    psVar38 = psStack_250;
    sStack_238.v[1] = (int64_t)psStack_250;
    sStack_188.v[1] = (int64_t)psStack_278;
    if (!bVar41) goto LAB_0011c51e;
    uVar12 = uVar25 + uVar15 >> 0x3e | (long)psVar9 * 4;
    psVar38 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
    uVar25 = (long)psVar27 * (long)psStack_268 + uVar12;
    psVar26 = (secp256k1_modinv64_signed62 *)
              (SUB168(SEXT816((long)psVar27) * SEXT816((long)psStack_268),8) +
               ((long)psVar9 >> 0x3e) + (ulong)CARRY8((long)psVar27 * (long)psStack_268,uVar12));
    uVar15 = (long)psVar36 * (long)psStack_240;
    lVar34 = SUB168(SEXT816((long)psVar36) * SEXT816((long)psStack_240),8);
    uVar12 = (ulong)(-uVar15 - 1 < uVar25);
    lVar13 = (0x7fffffffffffffff - lVar34) - (long)psVar26;
    lVar35 = (-0x8000000000000000 - lVar34) - (ulong)(uVar15 != 0);
    lVar18 = (long)psVar26 - lVar35;
    bVar41 = (SBORROW8(0x7fffffffffffffff - lVar34,(long)psVar26) != SBORROW8(lVar13,uVar12)) ==
             (long)(lVar13 - uVar12) < 0;
    if (lVar34 < 0) {
      bVar41 = (SBORROW8((long)psVar26,lVar35) != SBORROW8(lVar18,(ulong)(uVar25 < -uVar15))) ==
               (long)(lVar18 - (ulong)(uVar25 < -uVar15)) < 0;
    }
    psVar9 = (secp256k1_modinv64_signed62 *)(ulong)bVar41;
    psVar16 = psVar22;
    uVar12 = uVar8;
    if (bVar41 == false) goto LAB_0011c523;
    piVar31 = (int64_t *)((long)psStack_260->v + uStack_280);
    lVar13 = lVar14 + lVar19 + (ulong)CARRY8((ulong)psStack_260,uStack_280);
    psVar26 = (secp256k1_modinv64_signed62 *)
              ((long)psVar26->v + (ulong)CARRY8(uVar25,uVar15) + lVar34);
    uVar12 = lVar13 * 4 | (ulong)piVar31 >> 0x3e;
    psVar38 = (secp256k1_modinv64_signed62 *)((ulong)piVar31 & 0x3fffffffffffffff);
    uStack_280 = uVar25 + uVar15 & 0x3fffffffffffffff;
    psStack_268 = (secp256k1_modinv64_signed62 *)((long)psVar22 * (long)psStack_248 + uVar12);
    lVar14 = (lVar13 >> 0x3e) + SUB168(SEXT816((long)psVar22) * SEXT816((long)psStack_248),8) +
             (ulong)CARRY8((long)psVar22 * (long)psStack_248,uVar12);
    uVar29 = uVar8 * uStack_1d8;
    psVar9 = SUB168(SEXT816((long)uVar8) * SEXT816((long)uStack_1d8),8);
    uVar12 = (ulong)((secp256k1_modinv64_signed62 *)(-1 - uVar29) < psStack_268);
    lVar13 = (0x7fffffffffffffff - (long)psVar9) - lVar14;
    bVar41 = (SBORROW8(0x7fffffffffffffff - (long)psVar9,lVar14) != SBORROW8(lVar13,uVar12)) ==
             (long)(lVar13 - uVar12) < 0;
    uVar12 = CONCAT71((int7)(uVar8 >> 8),bVar41);
    lVar19 = (-0x8000000000000000 - (long)psVar9) - (ulong)(uVar29 != 0);
    lVar13 = lVar14 - lVar19;
    if ((long)psVar9 < 0) {
      bVar41 = (SBORROW8(lVar14,lVar19) !=
               SBORROW8(lVar13,(ulong)(psStack_268 < (secp256k1_modinv64_signed62 *)-uVar29))) ==
               (long)(lVar13 - (ulong)(psStack_268 < (secp256k1_modinv64_signed62 *)-uVar29)) < 0;
    }
    psVar16 = psStack_248;
    psVar40 = psVar27;
    sStack_238.v[2] = (int64_t)psVar38;
    sStack_188.v[2] = uStack_280;
    if (!bVar41) goto LAB_0011c528;
    uVar8 = uVar25 + uVar15 >> 0x3e | (long)psVar26 * 4;
    psVar40 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
    uVar12 = (long)psVar27 * (long)psStack_248 + uVar8;
    lVar34 = SUB168(SEXT816((long)psVar27) * SEXT816((long)psStack_248),8) + ((long)psVar26 >> 0x3e)
             + (ulong)CARRY8((long)psVar27 * (long)psStack_248,uVar8);
    uVar15 = (long)psVar36 * uStack_1d8;
    lVar18 = SUB168(SEXT816((long)psVar36) * SEXT816((long)uStack_1d8),8);
    uVar8 = (ulong)(-uVar15 - 1 < uVar12);
    lVar13 = (0x7fffffffffffffff - lVar18) - lVar34;
    lVar35 = (-0x8000000000000000 - lVar18) - (ulong)(uVar15 != 0);
    lVar19 = lVar34 - lVar35;
    bVar41 = (SBORROW8(0x7fffffffffffffff - lVar18,lVar34) != SBORROW8(lVar13,uVar8)) ==
             (long)(lVar13 - uVar8) < 0;
    if (lVar18 < 0) {
      bVar41 = (SBORROW8(lVar34,lVar35) != SBORROW8(lVar19,(ulong)(uVar12 < -uVar15))) ==
               (long)(lVar19 - (ulong)(uVar12 < -uVar15)) < 0;
    }
    psVar26 = (secp256k1_modinv64_signed62 *)(ulong)bVar41;
    if (bVar41 == false) goto LAB_0011c52d;
    piVar31 = (int64_t *)((long)psStack_268->v + uVar29);
    lVar13 = (long)psVar9->v + (ulong)CARRY8((ulong)psStack_268,uVar29) + lVar14;
    bVar41 = CARRY8(uVar12,uVar15);
    uVar12 = uVar12 + uVar15;
    lVar14 = lVar34 + lVar18 + (ulong)bVar41;
    psVar36 = (secp256k1_modinv64_modinfo *)(lVar13 * 4 | (ulong)piVar31 >> 0x3e);
    psVar26 = (secp256k1_modinv64_signed62 *)((ulong)piVar31 & 0x3fffffffffffffff);
    psVar9 = (secp256k1_modinv64_signed62 *)(uVar12 & 0x3fffffffffffffff);
    sStack_238.v[3] = (int64_t)psVar26;
    sStack_188.v[3] = (int64_t)psVar9;
    if ((lVar13 >> 0x3e) + -1 + (ulong)((secp256k1_modinv64_modinfo *)0x7fffffffffffffff < psVar36)
        != -1) goto LAB_0011c532;
    uVar12 = uVar12 >> 0x3e | lVar14 * 4;
    a_02 = psVar26;
    psVar30 = psVar9;
    sStack_238.v[4] = (int64_t)psVar36;
    if ((lVar14 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar12) != -1) goto LAB_0011c537;
    psVar40 = &sStack_238;
    a_02 = (secp256k1_modinv64_signed62 *)0x5;
    psVar16 = &secp256k1_const_modinfo_fe;
    pcStack_290 = (code *)0x11c20e;
    psVar30 = psVar40;
    psStack_268 = psVar26;
    psStack_240 = psVar9;
    sStack_188.v[4] = uVar12;
    iVar7 = secp256k1_modinv64_mul_cmp_62(psVar40,5,&secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar7 < 1) goto LAB_0011c53c;
    a_02 = (secp256k1_modinv64_signed62 *)0x5;
    pcStack_290 = (code *)0x11c22b;
    psVar30 = psVar40;
    iVar7 = secp256k1_modinv64_mul_cmp_62(psVar40,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (0 < iVar7) goto LAB_0011c541;
    psVar40 = &sStack_188;
    a_02 = (secp256k1_modinv64_signed62 *)0x5;
    pcStack_290 = (code *)0x11c252;
    psVar30 = psVar40;
    iVar7 = secp256k1_modinv64_mul_cmp_62(psVar40,5,&secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar7 < 1) goto LAB_0011c546;
    a_02 = (secp256k1_modinv64_signed62 *)0x5;
    pcStack_290 = (code *)0x11c274;
    psVar30 = psVar40;
    psStack_248 = psVar36;
    iVar7 = secp256k1_modinv64_mul_cmp_62(psVar40,5,&secp256k1_const_modinfo_fe.modulus,1);
    psVar17 = psStack_258;
    psVar16 = psStack_1d0;
    if (-1 < iVar7) goto LAB_0011c54b;
    uVar21 = (int)psStack_1d0 + 1;
    psVar16 = (secp256k1_modinv64_modinfo *)(ulong)uVar21;
    psVar28 = psStack_270;
    psStack_260 = psVar38;
  } while (uVar21 != 10);
  psVar30 = &sStack_188;
  a_02 = (secp256k1_modinv64_signed62 *)0x5;
  pcStack_290 = (code *)0x11c2bc;
  iVar7 = secp256k1_modinv64_mul_cmp_62(psVar30,5,&SECP256K1_SIGNED62_ONE,0);
  if (iVar7 == 0) {
    pcStack_290 = (code *)0x11c2e1;
    iVar7 = secp256k1_modinv64_mul_cmp_62(&sStack_238,5,&SECP256K1_SIGNED62_ONE,-1);
    psVar22 = extraout_RDX;
    if (iVar7 == 0) {
LAB_0011c396:
      pcStack_290 = (code *)0x11c3ab;
      secp256k1_modinv64_normalize_62(&sStack_138,(int64_t)psStack_248,psVar22);
      psVar20 = psStack_1e8;
      sStack_1b8.v[4] = sStack_138.v[4];
      sStack_1b8.v[2] = sStack_138.v[2];
      sStack_1b8.v[3] = sStack_138.v[3];
      sStack_1b8.v[0] = sStack_138.v[0];
      sStack_1b8.v[1] = sStack_138.v[1];
      pcStack_290 = (code *)0x11c3d9;
      secp256k1_fe_from_signed62(psStack_1e8,&sStack_1b8);
      psVar20->magnitude = (uint)(0 < psStack_200->magnitude);
      psVar20->normalized = 1;
      pcStack_290 = (code *)0x11c3fc;
      secp256k1_fe_verify(psVar20);
      uVar15 = (psVar20->n[4] >> 0x30) * lStack_208 + psVar20->n[0];
      uVar8 = (uVar15 >> 0x34) + psVar20->n[1];
      uVar25 = (uVar8 >> 0x34) + psVar20->n[2];
      uVar29 = (uVar25 >> 0x34) + psVar20->n[3];
      a_02 = (secp256k1_modinv64_signed62 *)((uVar29 >> 0x34) + (psVar20->n[4] & 0xffffffffffff));
      psVar30 = (secp256k1_modinv64_signed62 *)
                ((uVar15 ^ 0x1000003d0) & uVar8 & uVar25 & uVar29 & ((ulong)a_02 ^ 0xf000000000000))
      ;
      if ((uStack_1f8 != 0xfffffffffffff && uStack_1f0 != 0) !=
          (psVar30 == (secp256k1_modinv64_signed62 *)0xfffffffffffff ||
          ((uVar8 | uVar15 | uVar25 | uVar29) & 0xfffffffffffff) == 0 &&
          a_02 == (secp256k1_modinv64_signed62 *)0x0)) {
        secp256k1_fe_verify(psVar20);
        return;
      }
      goto LAB_0011c555;
    }
    pcStack_290 = (code *)0x11c304;
    iVar7 = secp256k1_modinv64_mul_cmp_62(&sStack_238,5,&SECP256K1_SIGNED62_ONE,1);
    psVar22 = extraout_RDX_00;
    if (iVar7 == 0) goto LAB_0011c396;
    psVar30 = &sStack_1b8;
    a_02 = (secp256k1_modinv64_signed62 *)0x5;
    pcStack_290 = (code *)0x11c327;
    iVar7 = secp256k1_modinv64_mul_cmp_62(psVar30,5,&SECP256K1_SIGNED62_ONE,0);
    if (iVar7 == 0) {
      psVar30 = &sStack_138;
      a_02 = (secp256k1_modinv64_signed62 *)0x5;
      pcStack_290 = (code *)0x11c34a;
      iVar7 = secp256k1_modinv64_mul_cmp_62(psVar30,5,&SECP256K1_SIGNED62_ONE,0);
      if (iVar7 == 0) {
        pcStack_290 = (code *)0x11c36d;
        iVar7 = secp256k1_modinv64_mul_cmp_62(&sStack_238,5,&secp256k1_const_modinfo_fe.modulus,1);
        psVar22 = extraout_RDX_01;
        if (iVar7 != 0) {
          psVar30 = &sStack_238;
          a_02 = (secp256k1_modinv64_signed62 *)0x5;
          pcStack_290 = (code *)0x11c38e;
          iVar7 = secp256k1_modinv64_mul_cmp_62(psVar30,5,&secp256k1_const_modinfo_fe.modulus,-1);
          psVar22 = extraout_RDX_02;
          if (iVar7 != 0) goto LAB_0011c55a;
        }
        goto LAB_0011c396;
      }
    }
  }
  else {
LAB_0011c550:
    pcStack_290 = (code *)0x11c555;
    secp256k1_fe_inv_cold_16();
LAB_0011c555:
    pcStack_290 = (code *)0x11c55a;
    secp256k1_fe_inv_cold_18();
  }
LAB_0011c55a:
  pcStack_290 = secp256k1_fe_from_signed62;
  secp256k1_fe_inv_cold_17();
  uVar8 = a_02->v[0];
  if (uVar8 >> 0x3e == 0) {
    uVar15 = a_02->v[1];
    if (0x3fffffffffffffff < uVar15) goto LAB_0011c62e;
    uVar25 = a_02->v[2];
    if (0x3fffffffffffffff < uVar25) goto LAB_0011c633;
    uVar29 = a_02->v[3];
    if (0x3fffffffffffffff < uVar29) goto LAB_0011c638;
    uVar11 = a_02->v[4];
    if (uVar11 < 0x100) {
      psVar30->v[0] = uVar8 & 0xfffffffffffff;
      psVar30->v[1] = (uVar15 & 0x3ffffffffff) << 10 | uVar8 >> 0x34;
      psVar30->v[2] = (uVar25 & 0xffffffff) << 0x14 | uVar15 >> 0x2a;
      psVar30->v[3] = (ulong)((uint)uVar29 & 0x3fffff) << 0x1e | uVar25 >> 0x20;
      psVar30->v[4] = uVar11 << 0x28 | uVar29 >> 0x16;
      return;
    }
  }
  else {
    psStack_298 = (secp256k1_modinv64_modinfo *)0x11c62e;
    secp256k1_fe_from_signed62_cold_5();
LAB_0011c62e:
    psStack_298 = (secp256k1_modinv64_modinfo *)0x11c633;
    secp256k1_fe_from_signed62_cold_4();
LAB_0011c633:
    psStack_298 = (secp256k1_modinv64_modinfo *)0x11c638;
    secp256k1_fe_from_signed62_cold_3();
LAB_0011c638:
    psStack_298 = (secp256k1_modinv64_modinfo *)0x11c63d;
    secp256k1_fe_from_signed62_cold_2();
  }
  psStack_298 = (secp256k1_modinv64_modinfo *)secp256k1_modinv64_update_de_62;
  secp256k1_fe_from_signed62_cold_1();
  psStack_298 = psVar16;
  psStack_2a0 = psVar40;
  uStack_2a8 = uVar12;
  psStack_2b0 = psVar17;
  psStack_2b8 = psVar36;
  psStack_2c0 = psVar20;
  lVar13 = psVar30->v[0];
  iStack_2c8 = psVar30->v[1];
  psStack_2d8 = (secp256k1_modinv64_signed62 *)psVar30->v[2];
  iStack_2e0 = psVar30->v[3];
  psVar17 = (secp256k1_modinv64_signed62 *)psVar30->v[4];
  psStack_320 = (secp256k1_modinv64_signed62 *)a_02->v[0];
  psVar28 = (secp256k1_modinv64_signed62 *)a_02->v[1];
  iStack_2d0 = a_02->v[2];
  psVar9 = (secp256k1_modinv64_signed62 *)a_02->v[3];
  uStack_330 = *extraout_RDX_03;
  psStack_328 = (secp256k1_modinv64_signed62 *)extraout_RDX_03[1];
  uStack_340 = extraout_RDX_03[2];
  psStack_338 = (secp256k1_modinv64_signed62 *)extraout_RDX_03[3];
  iStack_308 = a_02->v[4];
  psVar27 = (secp256k1_modinv64_signed62 *)0x5;
  psVar38 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
  psStack_350 = (secp256k1_modinv64_signed62 *)0x11c6db;
  psVar26 = psVar30;
  iVar7 = secp256k1_modinv64_mul_cmp_62(psVar30,5,&secp256k1_const_modinfo_fe.modulus,-2);
  if (iVar7 < 1) {
    psStack_350 = (secp256k1_modinv64_signed62 *)0x11d010;
    secp256k1_modinv64_update_de_62_cold_28();
LAB_0011d010:
    psStack_350 = (secp256k1_modinv64_signed62 *)0x11d015;
    secp256k1_modinv64_update_de_62_cold_27();
LAB_0011d015:
    psStack_350 = (secp256k1_modinv64_signed62 *)0x11d01a;
    secp256k1_modinv64_update_de_62_cold_26();
LAB_0011d01a:
    psStack_350 = (secp256k1_modinv64_signed62 *)0x11d01f;
    secp256k1_modinv64_update_de_62_cold_25();
LAB_0011d01f:
    psStack_350 = (secp256k1_modinv64_signed62 *)0x11d024;
    secp256k1_modinv64_update_de_62_cold_24();
LAB_0011d024:
    psStack_350 = (secp256k1_modinv64_signed62 *)0x11d029;
    secp256k1_modinv64_update_de_62_cold_23();
LAB_0011d029:
    psStack_350 = (secp256k1_modinv64_signed62 *)0x11d02e;
    secp256k1_modinv64_update_de_62_cold_1();
LAB_0011d02e:
    psStack_350 = (secp256k1_modinv64_signed62 *)0x11d033;
    secp256k1_modinv64_update_de_62_cold_2();
    psVar40 = psVar28;
LAB_0011d033:
    psStack_350 = (secp256k1_modinv64_signed62 *)0x11d038;
    secp256k1_modinv64_update_de_62_cold_3();
LAB_0011d038:
    psStack_350 = (secp256k1_modinv64_signed62 *)0x11d03d;
    secp256k1_modinv64_update_de_62_cold_4();
LAB_0011d03d:
    psStack_350 = (secp256k1_modinv64_signed62 *)0x11d042;
    secp256k1_modinv64_update_de_62_cold_5();
LAB_0011d042:
    psStack_350 = (secp256k1_modinv64_signed62 *)0x11d047;
    secp256k1_modinv64_update_de_62_cold_6();
LAB_0011d047:
    psStack_350 = (secp256k1_modinv64_signed62 *)0x11d04c;
    secp256k1_modinv64_update_de_62_cold_7();
    psVar28 = psVar27;
LAB_0011d04c:
    psStack_350 = (secp256k1_modinv64_signed62 *)0x11d051;
    secp256k1_modinv64_update_de_62_cold_8();
LAB_0011d051:
    psStack_350 = (secp256k1_modinv64_signed62 *)0x11d056;
    secp256k1_modinv64_update_de_62_cold_9();
LAB_0011d056:
    psStack_350 = (secp256k1_modinv64_signed62 *)0x11d05b;
    secp256k1_modinv64_update_de_62_cold_10();
LAB_0011d05b:
    psStack_350 = (secp256k1_modinv64_signed62 *)0x11d060;
    secp256k1_modinv64_update_de_62_cold_11();
LAB_0011d060:
    psStack_350 = (secp256k1_modinv64_signed62 *)0x11d065;
    secp256k1_modinv64_update_de_62_cold_12();
LAB_0011d065:
    iVar7 = (int)psVar28;
    psStack_350 = (secp256k1_modinv64_signed62 *)0x11d06a;
    secp256k1_modinv64_update_de_62_cold_13();
LAB_0011d06a:
    iVar23 = iVar7;
    psStack_350 = (secp256k1_modinv64_signed62 *)0x11d06f;
    secp256k1_modinv64_update_de_62_cold_14();
LAB_0011d06f:
    psStack_350 = (secp256k1_modinv64_signed62 *)0x11d074;
    secp256k1_modinv64_update_de_62_cold_15();
LAB_0011d074:
    iVar24 = iVar23;
    psVar30 = psVar40;
    psStack_350 = (secp256k1_modinv64_signed62 *)0x11d079;
    secp256k1_modinv64_update_de_62_cold_16();
LAB_0011d079:
    psStack_350 = (secp256k1_modinv64_signed62 *)0x11d07e;
    secp256k1_modinv64_update_de_62_cold_22();
LAB_0011d07e:
    psStack_350 = (secp256k1_modinv64_signed62 *)0x11d083;
    secp256k1_modinv64_update_de_62_cold_21();
LAB_0011d083:
    psStack_350 = (secp256k1_modinv64_signed62 *)0x11d088;
    secp256k1_modinv64_update_de_62_cold_20();
LAB_0011d088:
    psStack_350 = (secp256k1_modinv64_signed62 *)0x11d08d;
    secp256k1_modinv64_update_de_62_cold_19();
LAB_0011d08d:
    a_02 = psVar26;
    psStack_350 = (secp256k1_modinv64_signed62 *)0x11d092;
    secp256k1_modinv64_update_de_62_cold_18();
  }
  else {
    psVar38 = (secp256k1_modinv64_signed62 *)0x1;
    psVar27 = (secp256k1_modinv64_signed62 *)0x5;
    psStack_350 = (secp256k1_modinv64_signed62 *)0x11c6fc;
    psVar26 = psVar30;
    iVar7 = secp256k1_modinv64_mul_cmp_62(psVar30,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar7) goto LAB_0011d010;
    psVar27 = (secp256k1_modinv64_signed62 *)0x5;
    psVar38 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
    psStack_350 = (secp256k1_modinv64_signed62 *)0x11c71f;
    psVar26 = a_02;
    iVar7 = secp256k1_modinv64_mul_cmp_62(a_02,5,&secp256k1_const_modinfo_fe.modulus,-2);
    if (iVar7 < 1) goto LAB_0011d015;
    psVar38 = (secp256k1_modinv64_signed62 *)0x1;
    psVar27 = (secp256k1_modinv64_signed62 *)0x5;
    psStack_350 = (secp256k1_modinv64_signed62 *)0x11c740;
    psVar26 = a_02;
    iVar7 = secp256k1_modinv64_mul_cmp_62(a_02,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar7) goto LAB_0011d01a;
    psStack_350 = (secp256k1_modinv64_signed62 *)0x11c766;
    psStack_310 = psVar17;
    psStack_2f0 = psVar9;
    psVar9 = (secp256k1_modinv64_signed62 *)secp256k1_modinv64_abs(uStack_330);
    psStack_350 = (secp256k1_modinv64_signed62 *)0x11c773;
    psVar26 = psStack_328;
    iVar10 = secp256k1_modinv64_abs((int64_t)psStack_328);
    psVar38 = (secp256k1_modinv64_signed62 *)(0x4000000000000000 - iVar10);
    psVar17 = (secp256k1_modinv64_signed62 *)0x3fffffffffffffff;
    if ((long)psVar38 < (long)psVar9) goto LAB_0011d01f;
    psStack_350 = (secp256k1_modinv64_signed62 *)0x11c78f;
    psVar9 = (secp256k1_modinv64_signed62 *)secp256k1_modinv64_abs(uStack_340);
    psStack_350 = (secp256k1_modinv64_signed62 *)0x11c79c;
    psVar26 = psStack_338;
    iVar10 = secp256k1_modinv64_abs((int64_t)psStack_338);
    psVar38 = (secp256k1_modinv64_signed62 *)(0x4000000000000000 - iVar10);
    if ((long)psVar38 < (long)psVar9) goto LAB_0011d024;
    psVar17 = (secp256k1_modinv64_signed62 *)0x7fffffffffffffff;
    psVar27 = (secp256k1_modinv64_signed62 *)(uStack_330 * lVar13);
    psVar38 = SUB168(SEXT816((long)uStack_330) * SEXT816(lVar13),8);
    uVar12 = (long)psStack_328 * (long)psStack_320;
    lVar19 = SUB168(SEXT816((long)psStack_328) * SEXT816((long)psStack_320),8);
    lVar14 = (0x7fffffffffffffff - lVar19) - (long)psVar38;
    psVar26 = psStack_320;
    psStack_2e8 = psVar28;
    if (-1 < lVar19 &&
        (SBORROW8(0x7fffffffffffffff - lVar19,(long)psVar38) !=
        SBORROW8(lVar14,(ulong)((secp256k1_modinv64_signed62 *)~uVar12 < psVar27))) !=
        (long)(lVar14 - (ulong)((secp256k1_modinv64_signed62 *)~uVar12 < psVar27)) < 0)
    goto LAB_0011d029;
    piVar31 = (int64_t *)((long)psVar27->v + uVar12);
    lVar34 = (long)psVar38->v + (ulong)CARRY8(uVar12,(ulong)psVar27) + lVar19;
    psVar9 = (secp256k1_modinv64_signed62 *)(uStack_340 * lVar13);
    lVar19 = SUB168(SEXT816((long)uStack_340) * SEXT816(lVar13),8);
    uVar8 = (long)psStack_338 * (long)psStack_320;
    lVar18 = SUB168(SEXT816((long)psStack_338) * SEXT816((long)psStack_320),8);
    uVar12 = (ulong)((secp256k1_modinv64_signed62 *)(-uVar8 - 1) < psVar9);
    lVar13 = (0x7fffffffffffffff - lVar18) - lVar19;
    lVar14 = lVar13 - uVar12;
    bVar41 = (SBORROW8(0x7fffffffffffffff - lVar18,lVar19) != SBORROW8(lVar13,uVar12)) == lVar14 < 0
    ;
    psVar38 = (secp256k1_modinv64_signed62 *)
              CONCAT71((int7)((ulong)lVar14 >> 8),lVar18 < 0 || bVar41);
    if (lVar18 >= 0 && !bVar41) goto LAB_0011d02e;
    psVar38 = (secp256k1_modinv64_signed62 *)(iStack_308 >> 0x3f);
    lVar13 = ((ulong)psStack_328 & (ulong)psVar38) + (uStack_330 & (long)psStack_310 >> 0x3f);
    piVar32 = (int64_t *)((long)psVar9->v + uVar8);
    psVar26 = (secp256k1_modinv64_signed62 *)(lVar18 + lVar19 + (ulong)CARRY8(uVar8,(ulong)psVar9));
    psStack_2f8 = (secp256k1_modinv64_signed62 *)
                  (lVar13 - ((long)piVar31 * 0x27c7f6e22ddacacf + lVar13 & 0x3fffffffffffffffU));
    psVar9 = (secp256k1_modinv64_signed62 *)((long)psStack_2f8 * -0x1000003d1);
    lVar14 = SUB168(SEXT816((long)psStack_2f8) * SEXT816(-0x1000003d1),8);
    uVar12 = (ulong)((undefined1 *)((long)psStack_2f8 * 0x1000003d1 - 1U) < piVar31);
    lVar13 = (0x7fffffffffffffff - lVar14) - lVar34;
    psVar40 = (secp256k1_modinv64_signed62 *)
              ((-0x8000000000000000 - lVar14) -
              (ulong)(psVar9 != (secp256k1_modinv64_signed62 *)0x0));
    uVar8 = (ulong)(piVar31 < (undefined1 *)((long)psStack_2f8 * 0x1000003d1));
    bVar41 = (SBORROW8(lVar34,(long)psVar40) != SBORROW8(lVar34 - (long)psVar40,uVar8)) ==
             (long)((lVar34 - (long)psVar40) - uVar8) < 0;
    if ((long)psStack_2f8 < 1) {
      bVar41 = (SBORROW8(0x7fffffffffffffff - lVar14,lVar34) != SBORROW8(lVar13,uVar12)) ==
               (long)(lVar13 - uVar12) < 0;
    }
    psVar27 = psStack_2f8;
    psStack_320 = psVar30;
    psStack_318 = a_02;
    if (!bVar41) goto LAB_0011d033;
    lVar13 = ((ulong)psVar38 & (ulong)psStack_338) + ((long)psStack_310 >> 0x3f & uStack_340);
    psVar38 = (secp256k1_modinv64_signed62 *)
              (lVar13 - ((long)piVar32 * 0x27c7f6e22ddacacf + lVar13 & 0x3fffffffffffffffU));
    bVar41 = CARRY8((ulong)psVar9,(ulong)piVar31);
    psVar9 = (secp256k1_modinv64_signed62 *)((long)piVar31 + (long)psVar9->v);
    lVar34 = lVar14 + lVar34 + (ulong)bVar41;
    psVar27 = (secp256k1_modinv64_signed62 *)((long)psVar38 >> 0x3f);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = psVar38;
    uVar8 = SUB168(auVar1 * ZEXT816(0xfffffffefffffc2f),0);
    psVar40 = (secp256k1_modinv64_signed62 *)-(long)psVar38;
    lVar19 = (long)psVar40 +
             (long)psVar27 * -0x1000003d1 + SUB168(auVar1 * ZEXT816(0xfffffffefffffc2f),8);
    uVar12 = (ulong)((undefined1 *)(-uVar8 - 1) < piVar32);
    lVar13 = (0x7fffffffffffffff - lVar19) - (long)psVar26;
    lVar18 = (-0x8000000000000000 - lVar19) - (ulong)(uVar8 != 0);
    lVar14 = (long)psVar26 - lVar18;
    bVar41 = (SBORROW8((long)psVar26,lVar18) !=
             SBORROW8(lVar14,(ulong)(piVar32 < (undefined1 *)-uVar8))) ==
             (long)(lVar14 - (ulong)(piVar32 < (undefined1 *)-uVar8)) < 0;
    if ((long)psVar38 < 1) {
      bVar41 = (SBORROW8(0x7fffffffffffffff - lVar19,(long)psVar26) != SBORROW8(lVar13,uVar12)) ==
               (long)(lVar13 - uVar12) < 0;
    }
    psStack_300 = psVar27;
    if (!bVar41) goto LAB_0011d038;
    lVar13 = (long)psVar26 + (ulong)CARRY8(uVar8,(ulong)piVar32) + lVar19;
    if (((ulong)psVar9 & 0x3fffffffffffffff) != 0) goto LAB_0011d03d;
    if (((long)piVar32 + uVar8 & 0x3fffffffffffffff) != 0) goto LAB_0011d042;
    uVar12 = (ulong)psVar9 >> 0x3e | lVar34 * 4;
    uVar15 = uStack_330 * iStack_2c8 + uVar12;
    psVar26 = (secp256k1_modinv64_signed62 *)
              (SUB168(SEXT816((long)uStack_330) * SEXT816(iStack_2c8),8) + (lVar34 >> 0x3e) +
              (ulong)CARRY8(uStack_330 * iStack_2c8,uVar12));
    psVar9 = (secp256k1_modinv64_signed62 *)((long)psStack_328 * (long)psVar28);
    lVar18 = SUB168(SEXT816((long)psStack_328) * SEXT816((long)psVar28),8);
    uVar12 = (ulong)(-(long)psVar9 - 1U < uVar15);
    lVar14 = (0x7fffffffffffffff - lVar18) - (long)psVar26;
    lVar34 = (-0x8000000000000000 - lVar18) - (ulong)(psVar9 != (secp256k1_modinv64_signed62 *)0x0);
    lVar19 = (long)psVar26 - lVar34;
    bVar41 = (SBORROW8(0x7fffffffffffffff - lVar18,(long)psVar26) != SBORROW8(lVar14,uVar12)) ==
             (long)(lVar14 - uVar12) < 0;
    if (lVar18 < 0) {
      bVar41 = (SBORROW8((long)psVar26,lVar34) !=
               SBORROW8(lVar19,(ulong)(uVar15 < (ulong)-(long)psVar9))) ==
               (long)(lVar19 - (ulong)(uVar15 < (ulong)-(long)psVar9)) < 0;
    }
    psVar40 = psVar28;
    if (!bVar41) goto LAB_0011d047;
    uVar12 = (long)piVar32 + uVar8 >> 0x3e | lVar13 * 4;
    uVar25 = uStack_340 * iStack_2c8 + uVar12;
    lVar34 = SUB168(SEXT816((long)uStack_340) * SEXT816(iStack_2c8),8) + (lVar13 >> 0x3e) +
             (ulong)CARRY8(uStack_340 * iStack_2c8,uVar12);
    uVar8 = (long)psStack_338 * (long)psVar28;
    lVar19 = SUB168(SEXT816((long)psStack_338) * SEXT816((long)psVar28),8);
    uVar12 = (ulong)(-uVar8 - 1 < uVar25);
    lVar13 = (0x7fffffffffffffff - lVar19) - lVar34;
    lVar35 = (-0x8000000000000000 - lVar19) - (ulong)(uVar8 != 0);
    lVar14 = lVar34 - lVar35;
    bVar41 = (SBORROW8(0x7fffffffffffffff - lVar19,lVar34) != SBORROW8(lVar13,uVar12)) ==
             (long)(lVar13 - uVar12) < 0;
    if (lVar19 < 0) {
      bVar41 = (SBORROW8(lVar34,lVar35) != SBORROW8(lVar14,(ulong)(uVar25 < -uVar8))) ==
               (long)(lVar14 - (ulong)(uVar25 < -uVar8)) < 0;
    }
    psVar40 = (secp256k1_modinv64_signed62 *)(ulong)bVar41;
    psVar28 = psVar27;
    if (bVar41 == false) goto LAB_0011d04c;
    psVar28 = (secp256k1_modinv64_signed62 *)0x7fffffffffffffff;
    uVar11 = (long)psVar9->v + uVar15;
    lVar13 = (long)psVar26->v + (ulong)CARRY8(uVar15,(ulong)psVar9) + lVar18;
    lVar19 = lVar34 + lVar19 + (ulong)CARRY8(uVar25,uVar8);
    uVar12 = lVar13 * 4 | uVar11 >> 0x3e;
    psVar9 = (secp256k1_modinv64_signed62 *)(uVar25 + uVar8 & 0x3fffffffffffffff);
    uVar29 = uStack_330 * (long)psStack_2d8 + uVar12;
    psVar26 = (secp256k1_modinv64_signed62 *)
              ((lVar13 >> 0x3e) + SUB168(SEXT816((long)uStack_330) * SEXT816((long)psStack_2d8),8) +
              (ulong)CARRY8(uStack_330 * (long)psStack_2d8,uVar12));
    uVar15 = (long)psStack_328 * iStack_2d0;
    lVar14 = SUB168(SEXT816((long)psStack_328) * SEXT816(iStack_2d0),8);
    uVar12 = (ulong)(-uVar15 - 1 < uVar29);
    lVar13 = (0x7fffffffffffffff - lVar14) - (long)psVar26;
    psVar40 = (secp256k1_modinv64_signed62 *)((-0x8000000000000000 - lVar14) - (ulong)(uVar15 != 0))
    ;
    psVar30->v[0] = uVar11 & 0x3fffffffffffffff;
    a_02->v[0] = (int64_t)psVar9;
    bVar41 = (SBORROW8(0x7fffffffffffffff - lVar14,(long)psVar26) != SBORROW8(lVar13,uVar12)) ==
             (long)(lVar13 - uVar12) < 0;
    if (lVar14 < 0) {
      bVar41 = (SBORROW8((long)psVar26,(long)psVar40) !=
               SBORROW8((long)psVar26 - (long)psVar40,(ulong)(uVar29 < -uVar15))) ==
               (long)(((long)psVar26 - (long)psVar40) - (ulong)(uVar29 < -uVar15)) < 0;
    }
    psVar17 = psStack_2d8;
    if (!bVar41) goto LAB_0011d051;
    uVar12 = uVar25 + uVar8 >> 0x3e | lVar19 * 4;
    uVar25 = uStack_340 * (long)psStack_2d8 + uVar12;
    psVar9 = (secp256k1_modinv64_signed62 *)
             (SUB168(SEXT816((long)uStack_340) * SEXT816((long)psStack_2d8),8) + (lVar19 >> 0x3e) +
             (ulong)CARRY8(uStack_340 * (long)psStack_2d8,uVar12));
    uVar8 = (long)psStack_338 * iStack_2d0;
    lVar18 = SUB168(SEXT816((long)psStack_338) * SEXT816(iStack_2d0),8);
    uVar12 = (ulong)(-uVar8 - 1 < uVar25);
    lVar13 = (0x7fffffffffffffff - lVar18) - (long)psVar9;
    lVar34 = (-0x8000000000000000 - lVar18) - (ulong)(uVar8 != 0);
    lVar19 = (long)psVar9 - lVar34;
    bVar41 = (SBORROW8(0x7fffffffffffffff - lVar18,(long)psVar9) != SBORROW8(lVar13,uVar12)) ==
             (long)(lVar13 - uVar12) < 0;
    if (lVar18 < 0) {
      bVar41 = (SBORROW8((long)psVar9,lVar34) != SBORROW8(lVar19,(ulong)(uVar25 < -uVar8))) ==
               (long)(lVar19 - (ulong)(uVar25 < -uVar8)) < 0;
    }
    if (!bVar41) goto LAB_0011d056;
    lVar13 = (long)psVar26->v + (ulong)CARRY8(uVar29,uVar15) + lVar14;
    psVar9 = (secp256k1_modinv64_signed62 *)((long)psVar9->v + (ulong)CARRY8(uVar25,uVar8) + lVar18)
    ;
    uVar12 = lVar13 * 4 | uVar29 + uVar15 >> 0x3e;
    uVar33 = uStack_330 * iStack_2e0 + uVar12;
    psVar26 = (secp256k1_modinv64_signed62 *)
              ((lVar13 >> 0x3e) + SUB168(SEXT816((long)uStack_330) * SEXT816(iStack_2e0),8) +
              (ulong)CARRY8(uStack_330 * iStack_2e0,uVar12));
    uVar11 = (long)psStack_328 * (long)psStack_2f0;
    lVar14 = SUB168(SEXT816((long)psStack_328) * SEXT816((long)psStack_2f0),8);
    uVar12 = (ulong)(-uVar11 - 1 < uVar33);
    lVar13 = (0x7fffffffffffffff - lVar14) - (long)psVar26;
    psVar28 = (secp256k1_modinv64_signed62 *)0x0;
    psVar40 = (secp256k1_modinv64_signed62 *)((-0x8000000000000000 - lVar14) - (ulong)(uVar11 != 0))
    ;
    psVar30->v[1] = uVar29 + uVar15 & 0x3fffffffffffffff;
    a_02->v[1] = uVar25 + uVar8 & 0x3fffffffffffffff;
    bVar41 = (SBORROW8(0x7fffffffffffffff - lVar14,(long)psVar26) != SBORROW8(lVar13,uVar12)) ==
             (long)(lVar13 - uVar12) < 0;
    if (lVar14 < 0) {
      bVar41 = (SBORROW8((long)psVar26,(long)psVar40) !=
               SBORROW8((long)psVar26 - (long)psVar40,(ulong)(uVar33 < -uVar11))) ==
               (long)(((long)psVar26 - (long)psVar40) - (ulong)(uVar33 < -uVar11)) < 0;
    }
    psVar17 = psStack_2f0;
    if (!bVar41) goto LAB_0011d05b;
    uVar12 = uVar25 + uVar8 >> 0x3e | (long)psVar9 * 4;
    uVar15 = uStack_340 * iStack_2e0 + uVar12;
    lVar18 = SUB168(SEXT816((long)uStack_340) * SEXT816(iStack_2e0),8) + ((long)psVar9 >> 0x3e) +
             (ulong)CARRY8(uStack_340 * iStack_2e0,uVar12);
    uVar8 = (long)psStack_338 * (long)psStack_2f0;
    lVar19 = SUB168(SEXT816((long)psStack_338) * SEXT816((long)psStack_2f0),8);
    psVar17 = (secp256k1_modinv64_signed62 *)0x7fffffffffffffff;
    uVar12 = (ulong)(-uVar8 - 1 < uVar15);
    lVar13 = (0x7fffffffffffffff - lVar19) - lVar18;
    psVar9 = (secp256k1_modinv64_signed62 *)((-0x8000000000000000 - lVar19) - (ulong)(uVar8 != 0));
    bVar41 = (SBORROW8(lVar18,(long)psVar9) !=
             SBORROW8(lVar18 - (long)psVar9,(ulong)(uVar15 < -uVar8))) ==
             (long)((lVar18 - (long)psVar9) - (ulong)(uVar15 < -uVar8)) < 0;
    psVar40 = (secp256k1_modinv64_signed62 *)(ulong)bVar41;
    bVar2 = (SBORROW8(0x7fffffffffffffff - lVar19,lVar18) != SBORROW8(lVar13,uVar12)) ==
            (long)(lVar13 - uVar12) < 0;
    if (lVar19 < 0) {
      bVar2 = bVar41;
    }
    if (!bVar2) goto LAB_0011d060;
    lVar13 = (long)psVar26->v + (ulong)CARRY8(uVar33,uVar11) + lVar14;
    lVar19 = lVar18 + lVar19 + (ulong)CARRY8(uVar15,uVar8);
    uVar12 = lVar13 * 4 | uVar33 + uVar11 >> 0x3e;
    uVar29 = uStack_330 * (long)psStack_310 + uVar12;
    psVar26 = (secp256k1_modinv64_signed62 *)
              ((lVar13 >> 0x3e) + SUB168(SEXT816((long)uStack_330) * SEXT816((long)psStack_310),8) +
              (ulong)CARRY8(uStack_330 * (long)psStack_310,uVar12));
    uVar25 = (long)psStack_328 * iStack_308;
    lVar14 = SUB168(SEXT816((long)psStack_328) * SEXT816(iStack_308),8);
    uVar12 = (ulong)(-uVar25 - 1 < uVar29);
    lVar13 = (0x7fffffffffffffff - lVar14) - (long)psVar26;
    bVar41 = (SBORROW8(0x7fffffffffffffff - lVar14,(long)psVar26) != SBORROW8(lVar13,uVar12)) ==
             (long)(lVar13 - uVar12) < 0;
    psVar40 = (secp256k1_modinv64_signed62 *)CONCAT71((int7)(-uVar25 - 1 >> 8),bVar41);
    lVar18 = (-0x8000000000000000 - lVar14) - (ulong)(uVar25 != 0);
    lVar13 = (long)psVar26 - lVar18;
    psVar30->v[2] = uVar33 + uVar11 & 0x3fffffffffffffff;
    a_02->v[2] = uVar15 + uVar8 & 0x3fffffffffffffff;
    if (lVar14 < 0) {
      bVar41 = (SBORROW8((long)psVar26,lVar18) != SBORROW8(lVar13,(ulong)(uVar29 < -uVar25))) ==
               (long)(lVar13 - (ulong)(uVar29 < -uVar25)) < 0;
    }
    psVar28 = psStack_310;
    psVar9 = psVar30;
    if (!bVar41) goto LAB_0011d065;
    uVar12 = uVar15 + uVar8 >> 0x3e | lVar19 * 4;
    uVar15 = uVar29 + uVar25;
    psVar26 = (secp256k1_modinv64_signed62 *)
              ((long)psVar26->v + (ulong)CARRY8(uVar29,uVar25) + lVar14);
    uVar25 = uStack_340 * (long)psStack_310 + uVar12;
    lVar19 = SUB168(SEXT816((long)uStack_340) * SEXT816((long)psStack_310),8) + (lVar19 >> 0x3e) +
             (ulong)CARRY8(uStack_340 * (long)psStack_310,uVar12);
    uVar8 = (long)psStack_338 * iStack_308;
    lVar14 = SUB168(SEXT816((long)psStack_338) * SEXT816(iStack_308),8);
    uVar12 = (ulong)(-uVar8 - 1 < uVar25);
    lVar13 = (0x7fffffffffffffff - lVar14) - lVar19;
    iVar23 = 0;
    iVar24 = 0;
    psVar9 = (secp256k1_modinv64_signed62 *)((-0x8000000000000000 - lVar14) - (ulong)(uVar8 != 0));
    bVar41 = (SBORROW8(lVar19,(long)psVar9) !=
             SBORROW8(lVar19 - (long)psVar9,(ulong)(uVar25 < -uVar8))) ==
             (long)((lVar19 - (long)psVar9) - (ulong)(uVar25 < -uVar8)) < 0;
    psVar40 = (secp256k1_modinv64_signed62 *)(ulong)bVar41;
    bVar2 = (SBORROW8(0x7fffffffffffffff - lVar14,lVar19) != SBORROW8(lVar13,uVar12)) ==
            (long)(lVar13 - uVar12) < 0;
    if (lVar14 < 0) {
      bVar2 = bVar41;
    }
    iVar7 = 0;
    if (!bVar2) goto LAB_0011d06a;
    uVar29 = uVar25 + uVar8;
    lVar14 = lVar19 + lVar14 + (ulong)CARRY8(uVar25,uVar8);
    uVar11 = ((long)psStack_2f8 >> 0x3f) << 8 | (ulong)psStack_2f8 >> 0x38;
    uVar25 = (long)psStack_2f8 * 0x100;
    uVar12 = (ulong)((long)psStack_2f8 * -0x100 - 1U < uVar15);
    lVar13 = (0x7fffffffffffffff - uVar11) - (long)psVar26;
    psVar9 = (secp256k1_modinv64_signed62 *)((-0x8000000000000000 - uVar11) - (ulong)(uVar25 != 0));
    uVar8 = (ulong)(uVar15 < (ulong)((long)psStack_2f8 * -0x100));
    bVar41 = (SBORROW8((long)psVar26,(long)psVar9) != SBORROW8((long)psVar26 - (long)psVar9,uVar8))
             == (long)(((long)psVar26 - (long)psVar9) - uVar8) < 0;
    psVar40 = (secp256k1_modinv64_signed62 *)(ulong)bVar41;
    bVar2 = (SBORROW8(0x7fffffffffffffff - uVar11,(long)psVar26) != SBORROW8(lVar13,uVar12)) ==
            (long)(lVar13 - uVar12) < 0;
    if ((long)psStack_2f8 < 0) {
      bVar2 = bVar41;
    }
    if (!bVar2) goto LAB_0011d06f;
    uVar37 = (long)psVar27 << 8 | (ulong)psVar38 >> 0x38;
    uVar33 = (long)psVar38 * 0x100;
    uVar12 = (ulong)((long)psVar38 * -0x100 - 1U < uVar29);
    lVar13 = (0x7fffffffffffffff - uVar37) - lVar14;
    psVar9 = (secp256k1_modinv64_signed62 *)((-0x8000000000000000 - uVar37) - (ulong)(uVar33 != 0));
    uVar8 = (ulong)(uVar29 < (ulong)((long)psVar38 * -0x100));
    psVar17 = (secp256k1_modinv64_signed62 *)((lVar14 - (long)psVar9) - uVar8);
    bVar41 = (long)psVar38 < 0;
    psVar38 = (secp256k1_modinv64_signed62 *)
              (ulong)((SBORROW8(lVar14,(long)psVar9) != SBORROW8(lVar14 - (long)psVar9,uVar8)) ==
                     (long)psVar17 < 0);
    psVar40 = (secp256k1_modinv64_signed62 *)
              (ulong)((SBORROW8(0x7fffffffffffffff - uVar37,lVar14) != SBORROW8(lVar13,uVar12)) ==
                     (long)(lVar13 - uVar12) < 0);
    if (bVar41) {
      psVar40 = psVar38;
    }
    iVar23 = 0;
    if ((char)psVar40 == '\0') goto LAB_0011d074;
    lVar13 = (long)psVar26->v + CARRY8(uVar15,uVar25) + uVar11;
    lVar14 = lVar14 + uVar37 + (ulong)CARRY8(uVar29,uVar33);
    uVar12 = lVar13 * 4 | uVar15 + uVar25 >> 0x3e;
    psVar30->v[3] = uVar15 + uVar25 & 0x3fffffffffffffff;
    a_02->v[3] = uVar29 + uVar33 & 0x3fffffffffffffff;
    psVar38 = (secp256k1_modinv64_signed62 *)(uVar12 + 0x8000000000000000);
    psVar26 = (secp256k1_modinv64_signed62 *)
              ((lVar13 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar12));
    if (psVar26 != (secp256k1_modinv64_signed62 *)0xffffffffffffffff) goto LAB_0011d079;
    psVar38 = (secp256k1_modinv64_signed62 *)0xffffffffffffffff;
    uVar8 = uVar29 + uVar33 >> 0x3e | lVar14 * 4;
    psVar30->v[4] = uVar12;
    iVar24 = (int)uVar8;
    if ((lVar14 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar8) != -1) goto LAB_0011d07e;
    a_02->v[4] = uVar8;
    iVar24 = 5;
    psVar38 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
    psStack_350 = (secp256k1_modinv64_signed62 *)0x11cf8c;
    psVar26 = psVar30;
    iVar7 = secp256k1_modinv64_mul_cmp_62(psVar30,5,&secp256k1_const_modinfo_fe.modulus,-2);
    if (iVar7 < 1) goto LAB_0011d083;
    psVar38 = (secp256k1_modinv64_signed62 *)0x1;
    iVar24 = 5;
    psStack_350 = (secp256k1_modinv64_signed62 *)0x11cfad;
    psVar26 = psVar30;
    iVar7 = secp256k1_modinv64_mul_cmp_62(psVar30,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar7) goto LAB_0011d088;
    iVar24 = 5;
    psVar38 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
    psStack_350 = (secp256k1_modinv64_signed62 *)0x11cfd0;
    psVar26 = a_02;
    iVar7 = secp256k1_modinv64_mul_cmp_62(a_02,5,&secp256k1_const_modinfo_fe.modulus,-2);
    if (iVar7 < 1) goto LAB_0011d08d;
    psVar38 = (secp256k1_modinv64_signed62 *)0x1;
    iVar24 = 5;
    psStack_350 = (secp256k1_modinv64_signed62 *)0x11cff1;
    iVar7 = secp256k1_modinv64_mul_cmp_62(a_02,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (iVar7 < 0) {
      return;
    }
  }
  psStack_350 = (secp256k1_modinv64_signed62 *)secp256k1_modinv64_mul_cmp_62;
  secp256k1_modinv64_update_de_62_cold_17();
  psVar28 = &sStack_3b0;
  psStack_360 = psVar30;
  psStack_358 = psVar17;
  psStack_350 = psVar9;
  secp256k1_modinv64_mul_62(&sStack_388,a_02,iVar24,1);
  psVar30 = a_00;
  secp256k1_modinv64_mul_62(&sStack_3b0,a_00,5,(int64_t)psVar38);
  lVar13 = 0;
  while ((ulong)sStack_388.v[lVar13] < 0x4000000000000000) {
    if (0x3fffffffffffffff < (ulong)sStack_3b0.v[lVar13]) goto LAB_0011d127;
    lVar13 = lVar13 + 1;
    if (lVar13 == 4) {
      uVar21 = 4;
      while( true ) {
        if (sStack_388.v[uVar21] < sStack_3b0.v[uVar21]) {
          return;
        }
        if (sStack_3b0.v[uVar21] < sStack_388.v[uVar21]) break;
        bVar41 = uVar21 == 0;
        uVar21 = uVar21 - 1;
        if (bVar41) {
          return;
        }
      }
      return;
    }
  }
  secp256k1_modinv64_mul_cmp_62_cold_2();
LAB_0011d127:
  secp256k1_modinv64_mul_cmp_62_cold_1();
  lVar13 = psVar28->v[0];
  uVar12 = psVar28->v[1];
  uVar8 = psVar28->v[2];
  uVar15 = psVar28->v[3];
  lVar14 = psVar28->v[4];
  lVar19 = 0;
  do {
    if (psVar28->v[lVar19] < -0x3fffffffffffffff) {
      secp256k1_modinv64_normalize_62_cold_7();
LAB_0011d351:
      secp256k1_modinv64_normalize_62_cold_6();
      goto LAB_0011d356;
    }
    if (0x3fffffffffffffff < psVar28->v[lVar19]) goto LAB_0011d351;
    lVar19 = lVar19 + 1;
  } while (lVar19 != 5);
  iVar7 = secp256k1_modinv64_mul_cmp_62(psVar28,5,&secp256k1_const_modinfo_fe.modulus,-2);
  if (iVar7 < 1) {
LAB_0011d356:
    secp256k1_modinv64_normalize_62_cold_5();
LAB_0011d35b:
    secp256k1_modinv64_normalize_62_cold_4();
LAB_0011d360:
    secp256k1_modinv64_normalize_62_cold_3();
  }
  else {
    iVar7 = secp256k1_modinv64_mul_cmp_62(psVar28,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar7) goto LAB_0011d35b;
    uVar25 = lVar14 >> 0x3f;
    uVar39 = (long)psVar30 >> 0x3f;
    uVar29 = (lVar13 + (uVar25 & 0xfffffffefffffc2f) ^ uVar39) - uVar39;
    uVar11 = ((long)uVar29 >> 0x3e) + ((uVar12 ^ uVar39) - uVar39);
    uVar33 = ((long)uVar11 >> 0x3e) + ((uVar8 ^ uVar39) - uVar39);
    uVar37 = ((long)uVar33 >> 0x3e) + ((uVar15 ^ uVar39) - uVar39);
    lVar13 = ((long)uVar37 >> 0x3e) + (((uVar25 & 0x100) + lVar14 ^ uVar39) - uVar39);
    uVar15 = lVar13 >> 0x3f;
    uVar12 = (uVar15 & 0xfffffffefffffc2f) + (uVar29 & 0x3fffffffffffffff);
    uVar8 = ((long)uVar12 >> 0x3e) + (uVar11 & 0x3fffffffffffffff);
    uVar25 = ((long)uVar8 >> 0x3e) + (uVar33 & 0x3fffffffffffffff);
    uVar29 = ((long)uVar25 >> 0x3e) + (uVar37 & 0x3fffffffffffffff);
    uVar15 = ((long)uVar29 >> 0x3e) + (uVar15 & 0x100) + lVar13;
    psVar28->v[0] = uVar12 & 0x3fffffffffffffff;
    psVar28->v[1] = uVar8 & 0x3fffffffffffffff;
    psVar28->v[2] = uVar25 & 0x3fffffffffffffff;
    psVar28->v[3] = uVar29 & 0x3fffffffffffffff;
    psVar28->v[4] = uVar15;
    if (0x3fffffffffffffff < uVar15) goto LAB_0011d360;
    iVar7 = secp256k1_modinv64_mul_cmp_62(psVar28,5,&secp256k1_const_modinfo_fe.modulus,0);
    if (-1 < iVar7) {
      iVar7 = secp256k1_modinv64_mul_cmp_62(psVar28,5,&secp256k1_const_modinfo_fe.modulus,1);
      if (iVar7 < 0) {
        return;
      }
      goto LAB_0011d36a;
    }
  }
  secp256k1_modinv64_normalize_62_cold_2();
LAB_0011d36a:
  secp256k1_modinv64_normalize_62_cold_1();
  return;
}

Assistant:

static void secp256k1_gej_neg(secp256k1_gej *r, const secp256k1_gej *a) {
    secp256k1_gej_verify(a);
    r->infinity = a->infinity;
    r->x = a->x;
    r->y = a->y;
    r->z = a->z;
    secp256k1_fe_normalize_weak(&r->y);
    secp256k1_fe_negate(&r->y, &r->y, 1);
    secp256k1_gej_verify(r);
}